

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O2

bool __thiscall chrono::ChDirectSolverLS::Setup(ChDirectSolverLS *this,ChSystemDescriptor *sysd)

{
  ChSparseMatrix *this_00;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  rep_conflict rVar5;
  ChLog *pCVar6;
  ChStreamOutAscii *pCVar7;
  Index IVar8;
  byte bVal;
  ChDirectSolverLS *pCVar9;
  byte bVal_00;
  double dVar10;
  undefined1 auVar11 [16];
  ChSparsityPatternLearner sparsity_pattern;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  double local_c8;
  undefined8 uStack_c0;
  
  rVar5 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_assembly).m_start.__d.__r = rVar5;
  iVar3 = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  iVar4 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  this->m_dim = iVar4 + iVar3;
  if (this->m_use_learner == true) {
    if (this->m_force_update == false) {
      bVal = false;
      bVal_00 = this->m_lock ^ 1;
    }
    else {
      bVal_00 = true;
      bVal = false;
    }
  }
  else {
    if (this->m_setup_call == 0) {
      bVal = 1;
    }
    else {
      bVal = this->m_lock ^ 1;
    }
    bVal_00 = false;
  }
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    pCVar6 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"Solver setup\n");
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"  call number:    ");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,this->m_setup_call);
    ChStreamOutAscii::operator<<(pCVar7,"\n");
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"  use learner?    ");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,this->m_use_learner);
    ChStreamOutAscii::operator<<(pCVar7,"\n");
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"  pattern locked? ");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,this->m_lock);
    ChStreamOutAscii::operator<<(pCVar7,"\n");
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"  CALL learner:   ");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,(bool)bVal_00);
    ChStreamOutAscii::operator<<(pCVar7,"\n");
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"  CALL reserve:   ");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,(bool)bVal);
    ChStreamOutAscii::operator<<(pCVar7,"\n");
  }
  if ((bool)bVal_00 == false) {
    if ((bool)bVal != false) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = this->m_sparsity;
      uVar1 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar11,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      local_c8 = (double)((ulong)bVar2 * (long)(1.0 - this->m_sparsity) +
                         (ulong)!bVar2 * 0x3fb9999999999998);
      uStack_c0 = 0;
      Eigen::SparseMatrix<double,_1,_int>::resize(&this->m_mat,(long)this->m_dim,(long)this->m_dim);
      local_e8._M_dataplus._M_p._0_4_ = (int)((double)this->m_dim * local_c8);
      Eigen::DenseBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::Constant
                ((DenseBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&stack0xffffffffffffff48,
                 (long)this->m_dim,(Scalar *)&local_e8);
      Eigen::SparseMatrix<double,1,int>::
      reserveInnerVectors<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,_1,1,0,_1,1>>>
                ((SparseMatrix<double,1,int> *)&this->m_mat,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>_>
                  *)&stack0xffffffffffffff48);
    }
  }
  else {
    ChSparsityPatternLearner::ChSparsityPatternLearner
              ((ChSparsityPatternLearner *)&stack0xffffffffffffff48,this->m_dim,this->m_dim);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])
              (sysd,(ChSparsityPatternLearner *)&stack0xffffffffffffff48,0);
    ChSparsityPatternLearner::Apply
              ((ChSparsityPatternLearner *)&stack0xffffffffffffff48,&this->m_mat);
    this->m_force_update = false;
    ChSparsityPatternLearner::~ChSparsityPatternLearner
              ((ChSparsityPatternLearner *)&stack0xffffffffffffff48);
  }
  this_00 = &this->m_mat;
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,this_00,0);
  Eigen::SparseMatrix<double,_1,_int>::makeCompressed(this_00);
  ChTimer<double>::stop(&this->m_timer_setup_assembly);
  if ((this->super_ChSolverLS).super_ChSolver.write_matrix == true) {
    std::operator+(&local_e8,"LS_",&(this->super_ChSolverLS).super_ChSolver.frame_id);
    pCVar9 = (ChDirectSolverLS *)&stack0xffffffffffffff48;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar9,
                   &local_e8,"_A.dat");
    WriteMatrix(pCVar9,(string *)&stack0xffffffffffffff48,this_00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  rVar5 = std::chrono::_V2::system_clock::now();
  (this->m_timer_setup_solvercall).m_start.__d.__r = rVar5;
  iVar3 = (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xc])(this);
  ChTimer<double>::stop(&this->m_timer_setup_solvercall);
  if ((this->super_ChSolverLS).super_ChSolver.write_matrix == true) {
    std::operator+(&local_e8,"LS_",&(this->super_ChSolverLS).super_ChSolver.frame_id);
    pCVar9 = (ChDirectSolverLS *)&stack0xffffffffffffff48;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar9,
                   &local_e8,"_F.dat");
    WriteMatrix(pCVar9,(string *)&stack0xffffffffffffff48,this_00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii," Solver setup [");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,this->m_setup_call);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"] n = ");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,this->m_dim);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"  nnz = ");
    IVar8 = Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>::nonZeros
                      (&(this->m_mat).
                        super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,(int)IVar8);
    ChStreamOutAscii::operator<<(pCVar7,"\n");
    pCVar6 = GetLog();
    pCVar7 = ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"  assembly matrix:   ");
    dVar10 = ChTimer<double>::GetTimeSecondsIntermediate(&this->m_timer_setup_assembly);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,dVar10);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"s\n");
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,"  analyze+factorize: ");
    dVar10 = ChTimer<double>::GetTimeSecondsIntermediate(&this->m_timer_setup_solvercall);
    pCVar7 = ChStreamOutAscii::operator<<(pCVar7,dVar10);
    ChStreamOutAscii::operator<<(pCVar7,"s\n");
  }
  this->m_setup_call = this->m_setup_call + 1;
  if (SUB41(iVar3,0) == false) {
    pCVar6 = GetLog();
    ChStreamOutAscii::operator<<(&pCVar6->super_ChStreamOutAscii,"Solver setup failed\n");
    (*(this->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xe])(this);
  }
  return SUB41(iVar3,0);
}

Assistant:

bool ChDirectSolverLS::Setup(ChSystemDescriptor& sysd) {
    m_timer_setup_assembly.start();

    // Calculate problem size.
    // Note that ChSystemDescriptor::UpdateCountsAndOffsets was already called at the beginning of the step.
    m_dim = sysd.CountActiveVariables() + sysd.CountActiveConstraints();

    // If use of the sparsity pattern learner is enabled, call it if:
    // (a) an explicit update was requested (by default this is true at the first call), or
    // (b) the sparsity pattern is not locked and so has to be re-evaluated at each call
    bool call_learner = m_use_learner && (m_force_update || !m_lock);

    // If use of the sparsity pattern learner is disabled, reserve space for nonzeros,
    // using the current sparsity level estimate, if:
    // (a) this is the first call to setup, or
    // (b) the sparsity pattern is not locked and so has to be re-evaluated at each call
    bool call_reserve = !m_use_learner && (m_setup_call == 0 || !m_lock);

    if (verbose) {
        GetLog() << "Solver setup\n";
        GetLog() << "  call number:    " << m_setup_call << "\n";
        GetLog() << "  use learner?    " << m_use_learner << "\n";
        GetLog() << "  pattern locked? " << m_lock << "\n";
        GetLog() << "  CALL learner:   " << call_learner << "\n";
        GetLog() << "  CALL reserve:   " << call_reserve << "\n";
    }

    if (call_learner) {
        ChSparsityPatternLearner sparsity_pattern(m_dim, m_dim);
        sysd.ConvertToMatrixForm(&sparsity_pattern, nullptr);
        sparsity_pattern.Apply(m_mat);
        m_force_update = false;
    } else if (call_reserve) {
        double density = (m_sparsity > 0) ? 1 - m_sparsity : 1 - SPM_DEF_SPARSITY;
        m_mat.resize(m_dim, m_dim);
        m_mat.reserve(Eigen::VectorXi::Constant(m_dim, static_cast<int>(m_dim * density)));
    }

    // Let the system descriptor load the current matrix
    sysd.ConvertToMatrixForm(&m_mat, nullptr);

    // Allow the matrix to be compressed
    m_mat.makeCompressed();

    m_timer_setup_assembly.stop();

    if (write_matrix)
        WriteMatrix("LS_" + frame_id + "_A.dat", m_mat);

    // Let the concrete solver perform the facorization
    m_timer_setup_solvercall.start();
    bool result = FactorizeMatrix();
    m_timer_setup_solvercall.stop();

    if (write_matrix)
        WriteMatrix("LS_" + frame_id + "_F.dat", m_mat);

    if (verbose) {
        GetLog() << " Solver setup [" << m_setup_call << "] n = " << m_dim << "  nnz = " << (int)m_mat.nonZeros()
                 << "\n";
        GetLog() << "  assembly matrix:   " << m_timer_setup_assembly.GetTimeSecondsIntermediate() << "s\n"
                 << "  analyze+factorize: " << m_timer_setup_solvercall.GetTimeSecondsIntermediate() << "s\n";
    }

    m_setup_call++;

    if (!result) {
        // If the factorization failed, let the concrete solver display an error message.
        GetLog() << "Solver setup failed\n";
        PrintErrorMessage();
    }

    return result;
}